

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O1

bool __thiscall create::Create::setMode(Create *this,CreateMode *mode)

{
  bool bVar1;
  ProtocolVersion PVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  element_type *this_00;
  Opcode local_20 [2];
  
  PVar2 = RobotModel::getVersion(&this->model);
  if (PVar2 == V_1) {
    local_20[0] = OC_START;
    bVar1 = Serial::sendOpcode((this->serial).
                               super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               ,local_20);
    if (!bVar1) {
      return false;
    }
    local_20[1] = 0x82;
    bVar1 = Serial::sendOpcode((this->serial).
                               super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               ,local_20 + 1);
    if (!bVar1) {
      return false;
    }
  }
  switch(*mode) {
  case MODE_OFF:
    PVar2 = RobotModel::getVersion(&this->model);
    if (PVar2 == V_2) {
      poVar3 = (ostream *)&std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[create::Create] ",0x11);
      pcVar5 = "protocol version 2 does not support turning robot off";
      lVar4 = 0x35;
      goto LAB_00130f2b;
    }
    this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_20[0] = OC_POWER;
    break;
  case MODE_PASSIVE:
    this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_20[0] = OC_START;
    break;
  case MODE_SAFE:
    PVar2 = RobotModel::getVersion(&this->model);
    if (PVar2 < V_2) goto LAB_00130f57;
    this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_20[0] = OC_SAFE;
    break;
  case MODE_FULL:
    this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_20[0] = OC_FULL;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[create::Create] ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cannot set robot to mode \'",0x1a);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,*mode);
    pcVar5 = "\'";
    lVar4 = 1;
LAB_00130f2b:
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
LAB_00130f57:
    bVar1 = false;
    goto LAB_00130f72;
  }
  bVar1 = Serial::sendOpcode(this_00,local_20);
LAB_00130f72:
  if (bVar1 != false) {
    this->mode = *mode;
  }
  return bVar1;
}

Assistant:

bool Create::setMode(const CreateMode& mode) {
    if (model.getVersion() == V_1){
      // Switch to safe mode (required for compatibility with V_1)
      if (!(serial->sendOpcode(OC_START) && serial->sendOpcode(OC_CONTROL))) return false;
    }
    bool ret = false;
    switch (mode) {
      case MODE_OFF:
        if (model.getVersion() == V_2) {
          CERR("[create::Create] ", "protocol version 2 does not support turning robot off");
          ret = false;
        } else {
          ret = serial->sendOpcode(OC_POWER);
        }
        break;
      case MODE_PASSIVE:
        ret = serial->sendOpcode(OC_START);
        break;
      case MODE_SAFE:
        if (model.getVersion() > V_1) {
          ret = serial->sendOpcode(OC_SAFE);
        }
        break;
      case MODE_FULL:
        ret = serial->sendOpcode(OC_FULL);
        break;
      default:
        CERR("[create::Create] ", "cannot set robot to mode '" << mode << "'");
        ret = false;
    }
    if (ret) {
      this->mode = mode;
    }
    return ret;
  }